

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O0

pseudo_t linearize_store_gen(dmr_C *C,entrypoint *ep,pseudo_t value,access_data *ad)

{
  uint uVar1;
  symbol *type;
  symbol *psVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  pseudo_t ppVar6;
  pseudo_t ppVar7;
  ulong local_50;
  unsigned_long_long mask;
  pseudo_t orig;
  uint size;
  uint shift;
  symbol *ctype;
  pseudo_t store;
  access_data *ad_local;
  pseudo_t value_local;
  entrypoint *ep_local;
  dmr_C *C_local;
  
  iVar3 = type_size(ad->source_type);
  iVar4 = type_size(ad->result_type);
  ctype = (symbol *)value;
  if (iVar3 != iVar4) {
    type = ad->result_type;
    uVar1 = *(uint *)((long)&type->field_14 + 0xc);
    uVar5 = uVar1 & 0xff;
    iVar3 = (type->field_14).field_1.normal;
    ppVar6 = add_load(C,ep,ad);
    local_50 = (1L << ((byte)iVar3 & 0x3f)) - 1;
    if (uVar5 != 0) {
      psVar2 = ad->source_type;
      ppVar7 = dmrC_value_pseudo(C,type,(ulong)uVar5);
      ctype = (symbol *)add_binary_op(C,ep,psVar2,0x11,value,ppVar7);
      local_50 = local_50 << ((byte)uVar1 & 0x3f);
    }
    psVar2 = ad->source_type;
    ppVar7 = dmrC_value_pseudo(C,type,local_50 ^ 0xffffffffffffffff);
    ppVar6 = add_binary_op(C,ep,psVar2,0x14,ppVar6,ppVar7);
    ctype = (symbol *)add_binary_op(C,ep,ad->source_type,0x15,ppVar6,(pseudo_t)ctype);
  }
  add_store(C,ep,ad,(pseudo_t)ctype);
  return value;
}

Assistant:

static pseudo_t linearize_store_gen(struct dmr_C *C, struct entrypoint *ep,
		pseudo_t value,
		struct access_data *ad)
{
	pseudo_t store = value;

	if (type_size(ad->source_type) != type_size(ad->result_type)) {
		struct symbol *ctype = ad->result_type;
		unsigned int shift = ctype->bit_offset;
		unsigned int size = ctype->bit_size;
		pseudo_t orig = add_load(C, ep, ad);
		unsigned long long mask = (1ULL << size) - 1;

		if (shift) {
			store = add_binary_op(C, ep, ad->source_type, OP_SHL, value, dmrC_value_pseudo(C, ctype, shift));
			mask <<= shift;
		}
		orig = add_binary_op(C, ep, ad->source_type, OP_AND, orig, dmrC_value_pseudo(C, ctype, ~mask));
		store = add_binary_op(C, ep, ad->source_type, OP_OR, orig, store);
	}
	add_store(C, ep, ad, store);
	return value;
}